

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O2

void __thiscall
cppnet::BufferBlock::BufferBlock(BufferBlock *this,shared_ptr<cppnet::BlockMemoryPool> *alloter)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  
  (this->super_ListSlot<cppnet::BufferBlock>)._next.
  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ListSlot<cppnet::BufferBlock>)._next.
  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ListSlot<cppnet::BufferBlock>)._prev.
  super___weak_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ListSlot<cppnet::BufferBlock>)._prev.
  super___weak_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_InnerBuffer).super_Buffer._vptr_Buffer = (_func_int **)&PTR__BufferBlock_00125bc8;
  (this->super_ListSlot<cppnet::BufferBlock>)._vptr_ListSlot = (_func_int **)&DAT_00125c58;
  this->_can_read = false;
  std::__weak_ptr<cppnet::BlockMemoryPool,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<cppnet::BlockMemoryPool,void>
            ((__weak_ptr<cppnet::BlockMemoryPool,(__gnu_cxx::_Lock_policy)2> *)&this->_alloter,
             &alloter->super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>);
  iVar2 = (*((alloter->super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->_vptr_BlockMemoryPool[2])();
  this->_buffer_start = (char *)CONCAT44(extraout_var,iVar2);
  uVar3 = (*((alloter->super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->_vptr_BlockMemoryPool[5])();
  this->_total_size = uVar3;
  pcVar1 = this->_buffer_start;
  this->_buffer_end = pcVar1 + uVar3;
  this->_write = pcVar1;
  this->_read = pcVar1;
  return;
}

Assistant:

BufferBlock::BufferBlock(std::shared_ptr<BlockMemoryPool>& alloter) : 
    _can_read(false),
    _alloter(alloter) {

    _buffer_start = (char*)alloter->PoolLargeMalloc();
    _total_size = alloter->GetBlockLength();
    _buffer_end = _buffer_start + _total_size;
    _read = _write = _buffer_start;
}